

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzip2recover.c
# Opt level: O1

void bsPutBit(BitStream *bs,Int32 bit)

{
  int iVar1;
  
  if (bs->buffLive == 8) {
    iVar1 = putc(bs->buffer & 0xff,(FILE *)bs->handle);
    if (iVar1 == -1) {
      writeError();
    }
    bytesOut = bytesOut + 1;
    bs->buffLive = 1;
    bs->buffer = bit & 1;
  }
  else {
    bs->buffer = (bit & 1U) + bs->buffer * 2;
    bs->buffLive = bs->buffLive + 1;
  }
  return;
}

Assistant:

static void bsPutBit ( BitStream* bs, Int32 bit )
{
   if (bs->buffLive == 8) {
      Int32 retVal = putc ( (UChar) bs->buffer, bs->handle );
      if (retVal == EOF) writeError();
      bytesOut++;
      bs->buffLive = 1;
      bs->buffer = bit & 0x1;
   } else {
      bs->buffer = ( (bs->buffer << 1) | (bit & 0x1) );
      bs->buffLive++;
   };
}